

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_4::readPixelsGLES2(Functions *gl,Surface *dst)

{
  int width;
  int height;
  glReadPixelsFunc p_Var1;
  void *data;
  TextureFormat local_50;
  PixelBufferAccess local_48;
  
  p_Var1 = gl->readPixels;
  width = dst->m_width;
  height = dst->m_height;
  local_50.order = RGBA;
  local_50.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_48,&local_50,width,height,1,data);
  (*p_Var1)(0,0,width,height,0x1908,0x1401,local_48.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

static void readPixelsGLES2 (const glw::Functions& gl, tcu::Surface& dst)
{
	gl.readPixels(0, 0, dst.getWidth(), dst.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}